

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapeprism.cpp
# Opt level: O3

void pzshape::TPZShapePrism::ShapeInternal
               (TPZVec<double> *x,int order,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar7;
  int k;
  ulong uVar8;
  int iVar9;
  int i;
  ulong uVar10;
  int64_t size;
  int64_t size_3;
  TPZFNMatrix<20,_double> phi0;
  TPZFMatrix<double> local_780;
  double local_6f0 [21];
  TPZFMatrix<double> local_648;
  double local_5b8 [21];
  TPZFMatrix<double> local_510;
  double local_480 [21];
  TPZFMatrix<double> local_3d8;
  double local_348 [21];
  TPZFMatrix<double> local_2a0;
  double local_210 [21];
  TPZFMatrix<double> local_168;
  double local_d8 [21];
  ulong uVar5;
  ulong uVar6;
  
  if (2 < order) {
    uVar3 = order - 2;
    uVar5 = (ulong)uVar3;
    local_510.fElem = local_480;
    local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_01816bf8;
    local_510.fSize = 0x14;
    local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = uVar5;
    local_510.fGiven = local_510.fElem;
    TPZVec<int>::TPZVec(&local_510.fPivot.super_TPZVec<int>,0);
    local_510.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_510.fPivot.super_TPZVec<int>.fStore = local_510.fPivot.fExtAlloc;
    local_510.fPivot.super_TPZVec<int>.fNElements = 0;
    local_510.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_510.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_510.fWork.fStore = (double *)0x0;
    local_510.fWork.fNElements = 0;
    local_510.fWork.fNAlloc = 0;
    if (0x14 < uVar3) {
      local_510.fElem = (double *)operator_new__(uVar5 * 8);
    }
    local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_01816908;
    local_648.fElem = local_5b8;
    local_648.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    local_648.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_648.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_648.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_01816bf8;
    local_648.fSize = 0x14;
    local_648.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = uVar5;
    local_648.fGiven = local_648.fElem;
    TPZVec<int>::TPZVec(&local_648.fPivot.super_TPZVec<int>,0);
    local_648.fPivot.super_TPZVec<int>.fStore = local_648.fPivot.fExtAlloc;
    local_648.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_648.fPivot.super_TPZVec<int>.fNElements = 0;
    local_648.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_648.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_648.fWork.fStore = (double *)0x0;
    local_648.fWork.fNElements = 0;
    local_648.fWork.fNAlloc = 0;
    if (0x14 < uVar3) {
      local_648.fElem = (double *)operator_new__(uVar5 * 8);
    }
    uVar4 = order - 1;
    uVar6 = (ulong)uVar4;
    local_648.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_01816908;
    local_780.fElem = local_6f0;
    local_780.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    local_780.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_780.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_780.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_01816bf8;
    local_780.fSize = 0x14;
    local_780.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = uVar6;
    local_780.fGiven = local_780.fElem;
    TPZVec<int>::TPZVec(&local_780.fPivot.super_TPZVec<int>,0);
    local_780.fPivot.super_TPZVec<int>.fStore = local_780.fPivot.fExtAlloc;
    local_780.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_780.fPivot.super_TPZVec<int>.fNElements = 0;
    local_780.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_780.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_780.fWork.fStore = (double *)0x0;
    local_780.fWork.fNElements = 0;
    local_780.fWork.fNAlloc = 0;
    if (0x14 < uVar4) {
      local_780.fElem = (double *)operator_new__(uVar6 * 8);
    }
    local_780.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_01816908;
    local_168.fElem = local_d8;
    local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 1;
    local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_01816bf8;
    local_168.fSize = 0x14;
    local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = uVar5;
    local_168.fGiven = local_168.fElem;
    TPZVec<int>::TPZVec(&local_168.fPivot.super_TPZVec<int>,0);
    local_168.fPivot.super_TPZVec<int>.fStore = local_168.fPivot.fExtAlloc;
    local_168.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_168.fPivot.super_TPZVec<int>.fNElements = 0;
    local_168.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_168.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_168.fWork.fStore = (double *)0x0;
    local_168.fWork.fNElements = 0;
    local_168.fWork.fNAlloc = 0;
    if (0x14 < uVar3) {
      local_168.fElem = (double *)operator_new__(uVar5 * 8);
    }
    local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_01816908;
    local_2a0.fElem = local_210;
    local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 1;
    local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_01816bf8;
    local_2a0.fSize = 0x14;
    local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = uVar5;
    local_2a0.fGiven = local_2a0.fElem;
    TPZVec<int>::TPZVec(&local_2a0.fPivot.super_TPZVec<int>,0);
    local_2a0.fPivot.super_TPZVec<int>.fStore = local_2a0.fPivot.fExtAlloc;
    local_2a0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_2a0.fPivot.super_TPZVec<int>.fNElements = 0;
    local_2a0.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_2a0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_2a0.fWork.fStore = (double *)0x0;
    local_2a0.fWork.fNElements = 0;
    local_2a0.fWork.fNAlloc = 0;
    if (0x14 < uVar3) {
      local_2a0.fElem = (double *)operator_new__(uVar5 * 8);
    }
    local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_01816908;
    local_3d8.fElem = local_348;
    local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 1;
    local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_01816bf8;
    local_3d8.fSize = 0x14;
    local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = uVar6;
    local_3d8.fGiven = local_3d8.fElem;
    TPZVec<int>::TPZVec(&local_3d8.fPivot.super_TPZVec<int>,0);
    local_3d8.fPivot.super_TPZVec<int>.fStore = local_3d8.fPivot.fExtAlloc;
    local_3d8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_3d8.fPivot.super_TPZVec<int>.fNElements = 0;
    local_3d8.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_3d8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_3d8.fWork.fStore = (double *)0x0;
    local_3d8.fWork.fNElements = 0;
    local_3d8.fWork.fNAlloc = 0;
    if (0x14 < uVar4) {
      local_3d8.fElem = (double *)operator_new__(uVar6 * 8);
    }
    local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_01816908;
    (*(code *)TPZShapeLinear::fOrthogonal)
              (*x->fStore + *x->fStore + -1.0,uVar5,&local_510,&local_168);
    (*(code *)TPZShapeLinear::fOrthogonal)
              (x->fStore[1] + x->fStore[1] + -1.0,uVar5,&local_648,&local_2a0);
    (*(code *)TPZShapeLinear::fOrthogonal)(x->fStore[2],uVar6,&local_780,&local_3d8);
    uVar10 = 0;
    iVar9 = 0;
    do {
      uVar7 = 0;
      do {
        uVar8 = 0;
        do {
          if ((long)uVar7 < (long)(uVar5 - uVar10)) {
            if ((local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar10) ||
               (local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_648.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar7) ||
               (local_648.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_780.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar8) ||
               (local_780.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar2 = (long)iVar9;
            if ((iVar9 < 0) ||
               (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar2 ||
                ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)))) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            phi->fElem[lVar2] =
                 local_510.fElem[uVar10] * local_648.fElem[uVar7] * local_780.fElem[uVar8];
            if ((local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
               (local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar10)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_648.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar7) ||
               (local_648.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_780.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar8) ||
               (local_780.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar1 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
            if (((lVar1 < 1) || (iVar9 < 0)) ||
               ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar2)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            dphi->fElem[lVar1 * lVar2] =
                 (local_168.fElem
                  [local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar10] +
                 local_168.fElem
                 [local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar10]) *
                 local_648.fElem[uVar7] * local_780.fElem[uVar8];
            if ((local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar10) ||
               (local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
               (local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar7)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_780.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar8) ||
               (local_780.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar1 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
            if ((lVar1 < 2) ||
               ((iVar9 < 0 || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar2))))
            {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            dphi->fElem[lVar1 * lVar2 + 1] =
                 (local_510.fElem[uVar10] + local_510.fElem[uVar10]) *
                 local_2a0.fElem[local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar7]
                 * local_780.fElem[uVar8];
            if ((local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar10) ||
               (local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_648.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar7) ||
               (local_648.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
               (local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar8)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar1 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
            if (((lVar1 < 3) || (iVar9 < 0)) ||
               ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar2)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            dphi->fElem[lVar1 * lVar2 + 2] =
                 local_510.fElem[uVar10] * local_648.fElem[uVar7] *
                 local_3d8.fElem[local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar8]
            ;
            iVar9 = iVar9 + 1;
          }
          uVar8 = uVar8 + 1;
        } while (uVar6 != uVar8);
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar5);
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar5);
    TPZFMatrix<double>::~TPZFMatrix(&local_3d8,&PTR_PTR_01816bc0);
    TPZFMatrix<double>::~TPZFMatrix(&local_2a0,&PTR_PTR_01816bc0);
    TPZFMatrix<double>::~TPZFMatrix(&local_168,&PTR_PTR_01816bc0);
    TPZFMatrix<double>::~TPZFMatrix(&local_780,&PTR_PTR_01816bc0);
    TPZFMatrix<double>::~TPZFMatrix(&local_648,&PTR_PTR_01816bc0);
    TPZFMatrix<double>::~TPZFMatrix(&local_510,&PTR_PTR_01816bc0);
  }
  return;
}

Assistant:

void TPZShapePrism::ShapeInternal(TPZVec<REAL> &x, int order,TPZFMatrix<REAL> &phi,
									  TPZFMatrix<REAL> &dphi) {
		//valor da fun��o e derivada do produto das fun��es ortogonais
		if(order < 3) return;
		int ord1 = order-2;
		int ord2 = order-1;
		
		TPZFNMatrix<20,REAL> phi0(ord1,1),phi1(ord1,1),phi2(ord2,1),
		dphi0(1,ord1),dphi1(1,ord1),dphi2(1,ord2);
		TPZShapeLinear::fOrthogonal(2.*x[0]-1.,ord1,phi0,dphi0);//f e df       0<=x0<=1 -> -1<=2*x0-1<=1
		TPZShapeLinear::fOrthogonal(2.*x[1]-1.,ord1,phi1,dphi1);//g e dg             0<=x1<=1 -> -1<=2*x1-1<=1
		TPZShapeLinear::fOrthogonal(x[2],ord2,phi2,dphi2);//h e dh      -1<=x3<=1
		int index = 0;//x � ponto de integra��o dentro da pir�mide
		for (int i=0;i<ord1;i++) {
			for (int j=0;j<ord1;j++) {
				for (int k=0;k<ord2;k++) {
					if( i+j < ord1 && k < ord2) {
						phi(index,0) =     phi0(i,0)* phi1(j,0)* phi2(k,0);
						dphi(0,index) = 2.*dphi0(0,i)* phi1(j,0)* phi2(k,0);
						dphi(1,index) =  2.*phi0(i,0)*dphi1(0,j)* phi2(k,0);
						dphi(2,index) =     phi0(i,0)* phi1(j,0)*dphi2(0,k);
						index++;
					}
				}
			}
		}
	}